

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree-avl.c
# Opt level: O0

void pp_tree_avl_rotate_left(PTreeAVLNode *node,PTreeBaseNode **root)

{
  PTreeBaseNode **root_local;
  PTreeAVLNode *node_local;
  
  (node->parent->base).right = (node->base).left;
  if ((node->base).left != (PTreeBaseNode_ *)0x0) {
    (node->base).left[1].left = &node->parent->base;
  }
  (node->base).left = &node->parent->base;
  node->parent = (PTreeAVLNode_ *)(node->base).left[1].left;
  (node->base).left[1].left = &node->base;
  if (node->parent == (PTreeAVLNode_ *)0x0) {
    *root = &node->base;
  }
  else if ((node->parent->base).left == (node->base).left) {
    (node->parent->base).left = &node->base;
  }
  else {
    (node->parent->base).right = &node->base;
  }
  node->balance_factor = node->balance_factor + 1;
  *(pint *)&(node->base).left[1].right = -node->balance_factor;
  return;
}

Assistant:

static void
pp_tree_avl_rotate_left (PTreeAVLNode *node, PTreeBaseNode **root)
{
	node->parent->base.right = node->base.left;

	if (node->base.left != NULL)
		((PTreeAVLNode *) node->base.left)->parent = (PTreeAVLNode *) node->parent;

	node->base.left = (PTreeBaseNode *) node->parent;
	node->parent = ((PTreeAVLNode *) node->base.left)->parent;
	((PTreeAVLNode *) node->base.left)->parent = node;

	if (P_LIKELY (node->parent != NULL)) {
		if (node->parent->base.left == node->base.left)
			node->parent->base.left = (PTreeBaseNode *) node;
		else
			node->parent->base.right = (PTreeBaseNode *) node;
	} else
		*root = (PTreeBaseNode *) node;

	/* Restore balance factor */
	((PTreeAVLNode *) node)->balance_factor +=1;
	((PTreeAVLNode *) node->base.left)->balance_factor = -((PTreeAVLNode *) node)->balance_factor;
}